

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b.c
# Opt level: O2

int randomx_blake2b_final(blake2b_state *S,void *out,size_t outlen)

{
  uint64_t *puVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  uint8_t buffer [64];
  
  buffer[0x30] = '\0';
  buffer[0x31] = '\0';
  buffer[0x32] = '\0';
  buffer[0x33] = '\0';
  buffer[0x34] = '\0';
  buffer[0x35] = '\0';
  buffer[0x36] = '\0';
  buffer[0x37] = '\0';
  buffer[0x38] = '\0';
  buffer[0x39] = '\0';
  buffer[0x3a] = '\0';
  buffer[0x3b] = '\0';
  buffer[0x3c] = '\0';
  buffer[0x3d] = '\0';
  buffer[0x3e] = '\0';
  buffer[0x3f] = '\0';
  buffer[0x20] = '\0';
  buffer[0x21] = '\0';
  buffer[0x22] = '\0';
  buffer[0x23] = '\0';
  buffer[0x24] = '\0';
  buffer[0x25] = '\0';
  buffer[0x26] = '\0';
  buffer[0x27] = '\0';
  buffer[0x28] = '\0';
  buffer[0x29] = '\0';
  buffer[0x2a] = '\0';
  buffer[0x2b] = '\0';
  buffer[0x2c] = '\0';
  buffer[0x2d] = '\0';
  buffer[0x2e] = '\0';
  buffer[0x2f] = '\0';
  buffer[0x10] = '\0';
  buffer[0x11] = '\0';
  buffer[0x12] = '\0';
  buffer[0x13] = '\0';
  buffer[0x14] = '\0';
  buffer[0x15] = '\0';
  buffer[0x16] = '\0';
  buffer[0x17] = '\0';
  buffer[0x18] = '\0';
  buffer[0x19] = '\0';
  buffer[0x1a] = '\0';
  buffer[0x1b] = '\0';
  buffer[0x1c] = '\0';
  buffer[0x1d] = '\0';
  buffer[0x1e] = '\0';
  buffer[0x1f] = '\0';
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  buffer[8] = '\0';
  buffer[9] = '\0';
  buffer[10] = '\0';
  buffer[0xb] = '\0';
  buffer[0xc] = '\0';
  buffer[0xd] = '\0';
  buffer[0xe] = '\0';
  buffer[0xf] = '\0';
  iVar4 = -1;
  if (((out != (void *)0x0 && S != (blake2b_state *)0x0) && (S->outlen <= outlen)) && (S->f[0] == 0)
     ) {
    uVar3 = S->buflen;
    uVar5 = (ulong)uVar3;
    puVar1 = S->t;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar5;
    S->t[1] = S->t[1] + (ulong)CARRY8(uVar2,uVar5);
    if (S->last_node != '\0') {
      S->f[1] = 0xffffffffffffffff;
    }
    S->f[0] = 0xffffffffffffffff;
    memset(S->buf + uVar5,0,(ulong)(0x80 - uVar3));
    blake2b_compress(S,S->buf);
    for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
      *(uint64_t *)(buffer + lVar6 * 8) = S->h[lVar6];
    }
    memcpy(out,buffer,(ulong)S->outlen);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int blake2b_final(blake2b_state *S, void *out, size_t outlen) {
	uint8_t buffer[BLAKE2B_OUTBYTES] = { 0 };
	unsigned int i;

	/* Sanity checks */
	if (S == NULL || out == NULL || outlen < S->outlen) {
		return -1;
	}

	/* Is this a reused state? */
	if (S->f[0] != 0) {
		return -1;
	}

	blake2b_increment_counter(S, S->buflen);
	blake2b_set_lastblock(S);
	memset(&S->buf[S->buflen], 0, BLAKE2B_BLOCKBYTES - S->buflen); /* Padding */
	blake2b_compress(S, S->buf);

	for (i = 0; i < 8; ++i) { /* Output full hash to temp buffer */
		store64(buffer + sizeof(S->h[i]) * i, S->h[i]);
	}

	memcpy(out, buffer, S->outlen);
	//clear_internal_memory(buffer, sizeof(buffer));
	//clear_internal_memory(S->buf, sizeof(S->buf));
	//clear_internal_memory(S->h, sizeof(S->h));
	return 0;
}